

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test<int>(int expected,string *value)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  AssertHelper local_60;
  AssertionResult gtest_ar_;
  int expected_local;
  int result2;
  int result;
  AssertionResult gtest_ar;
  undefined1 local_20 [16];
  
  sVar4 = value->_M_string_length;
  if (sVar4 == 0) {
LAB_0011d2a5:
    bVar2 = false;
    result = 0;
  }
  else {
    pcVar3 = (value->_M_dataplus)._M_p;
    pcVar9 = pcVar3 + sVar4;
    if (*pcVar3 == '-') {
      if (sVar4 == 1) goto LAB_0011d2a5;
      pcVar3 = pcVar3 + 1;
      sVar5 = 0;
      do {
        iVar6 = (int)sVar5;
        if ((byte)(*pcVar3 - 0x3aU) < 0xf6) {
LAB_0011cf6c:
          bVar2 = false;
          uVar7 = sVar5;
        }
        else {
          bVar8 = *pcVar3 - 0x30;
          if ((iVar6 < -0xccccccc) || (in_R9B = 8 < bVar8, iVar6 == -0xccccccc && (bool)in_R9B))
          goto LAB_0011cf6c;
          bVar2 = true;
          sVar5 = sVar4;
          uVar7 = (ulong)(iVar6 * 10 - (uint)bVar8);
        }
        result = (int)sVar5;
        if (!bVar2) goto LAB_0011cfd3;
        pcVar3 = pcVar3 + 1;
        sVar4 = sVar5;
        sVar5 = uVar7;
        result = (int)uVar7;
      } while (pcVar3 < pcVar9);
    }
    else {
      if (*pcVar3 == '+') {
        pcVar3 = pcVar3 + 1;
      }
      if (pcVar3 == pcVar9) goto LAB_0011d2a5;
      sVar5 = 0;
      do {
        iVar6 = (int)sVar5;
        if ((byte)(*pcVar3 - 0x3aU) < 0xf6) {
LAB_0011cfcd:
          bVar2 = false;
          uVar7 = sVar5;
        }
        else {
          bVar8 = *pcVar3 - 0x30;
          if ((0xccccccc < iVar6) || (in_R9B = 7 < bVar8, iVar6 == 0xccccccc && (bool)in_R9B))
          goto LAB_0011cfcd;
          bVar2 = true;
          sVar5 = sVar4;
          uVar7 = (ulong)((uint)bVar8 + iVar6 * 10);
        }
        result = (int)sVar5;
        if (!bVar2) goto LAB_0011cfd3;
        pcVar3 = pcVar3 + 1;
        sVar4 = sVar5;
        sVar5 = uVar7;
        result = (int)uVar7;
      } while (pcVar3 < pcVar9);
    }
    bVar2 = true;
  }
LAB_0011cfdb:
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  expected_local = expected;
  if (bVar2 == false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x1434ac,"false","true"
               ,(char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&result2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x18,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&result2,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result2);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_20) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"expected","result",&expected_local,&result);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0x19,pcVar9);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (gtest_ar_._0_8_ != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      sVar4 = value->_M_string_length;
      result2 = 0;
      if (sVar4 != 0) {
        pcVar9 = (value->_M_dataplus)._M_p;
        result2 = 0;
        if (*pcVar9 == '-') {
          if (sVar4 != 1) {
            result2 = 0;
            sVar5 = 1;
            do {
              result2 = (result2 * 10 - (int)pcVar9[sVar5]) + 0x30;
              sVar5 = sVar5 + 1;
            } while (sVar4 != sVar5);
          }
        }
        else {
          pcVar3 = pcVar9 + sVar4;
          if (*pcVar9 == '+') {
            pcVar9 = pcVar9 + 1;
          }
          if (pcVar9 != pcVar3) {
            result2 = 0;
            do {
              cVar1 = *pcVar9;
              pcVar9 = pcVar9 + 1;
              result2 = result2 * 10 + (int)cVar1 + -0x30;
            } while (pcVar9 != pcVar3);
          }
        }
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"expected","result2",&expected_local,&result2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = "";
        }
        else {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x1c,pcVar9);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (gtest_ar_._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
LAB_0011cfd3:
  bVar2 = false;
  goto LAB_0011cfdb;
}

Assistant:

static void test(T expected, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_TRUE(valid);
  ASSERT_EQ(expected, result);
  
  T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
  ASSERT_EQ(expected, result2);
}